

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QOpenFolderButton.cpp
# Opt level: O0

void QOpenFolderButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  Int *pIVar2;
  Options OVar3;
  QOpenFolderButton *this;
  undefined8 *in_RCX;
  uint in_EDX;
  int in_ESI;
  void *_v_1;
  QOpenFolderButton *_t_2;
  void *_v;
  QOpenFolderButton *_t_1;
  int *result;
  QOpenFolderButton *_t;
  QOpenFolderButton *in_stack_ffffffffffffff48;
  QString *in_stack_ffffffffffffff50;
  QString *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      filePathChanged((QOpenFolderButton *)
                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff58);
    }
  }
  else if (in_ESI == 5) {
    pcVar1 = *(code **)in_RCX[1];
    if (pcVar1 == filePathChanged && (pcVar1 == (code *)0x0 || ((long *)in_RCX[1])[1] == 0)) {
      *(undefined4 *)*in_RCX = 0;
    }
  }
  else if (in_ESI == 1) {
    pIVar2 = (Int *)*in_RCX;
    switch(in_EDX) {
    case 0:
      filePath(in_stack_ffffffffffffff48);
      QString::operator=(in_stack_ffffffffffffff50,(QString *)in_stack_ffffffffffffff48);
      QString::~QString((QString *)0x1d72a5);
      break;
    case 1:
      caption(in_stack_ffffffffffffff48);
      QString::operator=(in_stack_ffffffffffffff50,(QString *)in_stack_ffffffffffffff48);
      QString::~QString((QString *)0x1d72d8);
      break;
    case 2:
      directory(in_stack_ffffffffffffff48);
      QString::operator=(in_stack_ffffffffffffff50,(QString *)in_stack_ffffffffffffff48);
      QString::~QString((QString *)0x1d7308);
      break;
    case 3:
      OVar3 = options(in_stack_ffffffffffffff48);
      *pIVar2 = OVar3.i;
    }
  }
  else if (in_ESI == 2) {
    this = (QOpenFolderButton *)(ulong)in_EDX;
    switch(this) {
    case (QOpenFolderButton *)0x0:
      setFilePath(this,(QString *)in_stack_ffffffffffffff48);
      break;
    case (QOpenFolderButton *)0x1:
      setCaption(this,(QString *)in_stack_ffffffffffffff48);
      break;
    case (QOpenFolderButton *)0x2:
      setDirectory(this,(QString *)in_stack_ffffffffffffff48);
      break;
    case (QOpenFolderButton *)0x3:
      setOptions(in_stack_ffffffffffffff48,(Options)0x0);
    }
  }
  return;
}

Assistant:

void QOpenFolderButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QOpenFolderButton *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->filePathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QOpenFolderButton::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QOpenFolderButton::filePathChanged)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QOpenFolderButton *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QString*>(_v) = _t->filePath(); break;
        case 1: *reinterpret_cast< QString*>(_v) = _t->caption(); break;
        case 2: *reinterpret_cast< QString*>(_v) = _t->directory(); break;
        case 3: *reinterpret_cast< QFileDialog::Options*>(_v) = _t->options(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QOpenFolderButton *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFilePath(*reinterpret_cast< QString*>(_v)); break;
        case 1: _t->setCaption(*reinterpret_cast< QString*>(_v)); break;
        case 2: _t->setDirectory(*reinterpret_cast< QString*>(_v)); break;
        case 3: _t->setOptions(*reinterpret_cast< QFileDialog::Options*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}